

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

int wiz_timeout_queue(void)

{
  nh_menuitem *pnVar1;
  long lVar2;
  char *pcVar3;
  timer_element *ptVar4;
  menulist menu;
  char buf [256];
  char local_138 [264];
  
  init_menulist(&menu);
  sprintf(buf,"Current time = %u.",(ulong)moves);
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  pnVar1 = menu.items + menu.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,buf);
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  menu.items[lVar2].caption[0] = '\0';
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  builtin_strncpy(menu.items[lVar2].caption,"Active timeout q",0x10);
  builtin_strncpy(menu.items[lVar2].caption + 0xe," queue:",8);
  menu.icount = menu.icount + 1;
  lVar2 = (long)menu.size;
  if (menu.size <= menu.icount) {
    menu.size = menu.size * 2;
    menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
  }
  lVar2 = (long)menu.icount;
  menu.items[lVar2].accel = '\0';
  menu.items[lVar2].group_accel = '\0';
  menu.items[lVar2].selected = '\0';
  menu.items[lVar2].caption[0] = '\0';
  menu.items[lVar2].id = 0;
  menu.items[lVar2].role = MI_TEXT;
  menu.icount = menu.icount + 1;
  ptVar4 = level->lev_timers;
  lVar2 = (long)menu.size;
  if (ptVar4 == (timer_element *)0x0) {
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
    }
    lVar2 = (long)menu.icount;
    menu.items[lVar2].id = 0;
    menu.items[lVar2].role = MI_TEXT;
    menu.items[lVar2].accel = '\0';
    menu.items[lVar2].group_accel = '\0';
    menu.items[lVar2].selected = '\0';
    builtin_strncpy(menu.items[lVar2].caption,"<empty>",8);
    menu.icount = menu.icount + 1;
  }
  else {
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
    }
    lVar2 = (long)menu.icount;
    menu.items[lVar2].id = 0;
    menu.items[lVar2].role = MI_TEXT;
    menu.items[lVar2].accel = '\0';
    menu.items[lVar2].group_accel = '\0';
    menu.items[lVar2].selected = '\0';
    builtin_strncpy(menu.items[lVar2].caption,"timeout  id   ki",0x10);
    builtin_strncpy(menu.items[lVar2].caption + 10,"d   kind   call",0x10);
    menu.icount = menu.icount + 1;
    do {
      pcVar3 = "unknown";
      if ((ulong)(ushort)ptVar4->kind < 3) {
        pcVar3 = &DAT_002d2bd0 + *(int *)(&DAT_002d2bd0 + (ulong)(ushort)ptVar4->kind * 4);
      }
      sprintf(local_138," %4u  %4u   %-6s #%d %s (%p)",(ulong)ptVar4->timeout,(ulong)ptVar4->tid,
              pcVar3,(ulong)ptVar4->func_index,timeout_funcs[ptVar4->func_index].name,ptVar4->arg);
      lVar2 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar2 * 0x218);
      }
      pnVar1 = menu.items + menu.icount;
      pnVar1->id = 0;
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_138);
      menu.icount = menu.icount + 1;
      ptVar4 = ptVar4->next;
    } while (ptVar4 != (timer_element *)0x0);
  }
  display_menu(menu.items,menu.icount,(char *)0x0,0,(int *)0x0);
  free(menu.items);
  return 0;
}

Assistant:

int wiz_timeout_queue(void)
{
    char buf[BUFSZ];
    struct menulist menu;

    init_menulist(&menu);

    sprintf(buf, "Current time = %u.", moves);
    add_menutext(&menu, buf);
    add_menutext(&menu, "");
    add_menutext(&menu, "Active timeout queue:");
    add_menutext(&menu, "");
    print_queue(&menu, level->lev_timers);

    display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    free(menu.items);

    return 0;
}